

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O1

void parse_decode_block(AV1Decoder *pbi,ThreadData *td,int mi_row,int mi_col,aom_reader *r,
                       PARTITION_TYPE partition,BLOCK_SIZE bsize)

{
  aom_cdf_prob *paVar1;
  byte bVar2;
  uint8_t uVar3;
  BLOCK_SIZE BVar4;
  _Bool _Var5;
  _Bool _Var6;
  ushort uVar7;
  ushort uVar8;
  SequenceHeader *pSVar9;
  MB_MODE_INFO **ppMVar10;
  MB_MODE_INFO *mbmi_00;
  MB_MODE_INFO *pMVar11;
  FRAME_CONTEXT *pFVar12;
  bool bVar13;
  short sVar14;
  int16_t iVar15;
  int iVar16;
  uint plane_end;
  long lVar17;
  byte bVar18;
  ulong uVar19;
  int idy;
  int iVar20;
  ulong uVar21;
  long lVar22;
  ulong uVar23;
  ENTROPY_CONTEXT **ppEVar24;
  byte bVar25;
  uint uVar26;
  ENTROPY_CONTEXT (*paEVar27) [32];
  uint uVar28;
  long lVar29;
  byte bVar30;
  int idx;
  int iVar31;
  int16_t *piVar32;
  int iVar33;
  uint uVar34;
  uint uVar35;
  aom_cdf_prob (*icdf) [4];
  undefined4 uVar36;
  undefined1 auVar37 [16];
  MB_MODE_INFO *mbmi;
  uint local_80;
  
  pSVar9 = (pbi->common).seq_params;
  uVar21 = (ulong)bsize;
  bVar30 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[uVar21];
  bVar2 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[uVar21];
  uVar35 = (pbi->common).mi_params.mi_cols - mi_col;
  if ((int)(uint)bVar30 <= (int)uVar35) {
    uVar35 = (uint)bVar30;
  }
  uVar26 = (pbi->common).mi_params.mi_rows - mi_row;
  if ((int)(uint)bVar2 <= (int)uVar26) {
    uVar26 = (uint)bVar2;
  }
  uVar3 = pSVar9->monochrome;
  iVar33 = (pbi->common).mi_params.mi_stride;
  iVar16 = iVar33 * mi_row + mi_col;
  (pbi->common).mi_params.mi_grid_base[iVar16] =
       (pbi->common).mi_params.mi_alloc +
       ((mi_row / (int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                             [(pbi->common).mi_params.mi_alloc_bsize]) *
        (pbi->common).mi_params.mi_alloc_stride +
       mi_col / (int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                           [(pbi->common).mi_params.mi_alloc_bsize]);
  ppMVar10 = (pbi->common).mi_params.mi_grid_base + iVar16;
  (td->dcb).xd.mi = ppMVar10;
  (td->dcb).xd.tx_type_map = (pbi->common).mi_params.tx_type_map + iVar16;
  (td->dcb).xd.tx_type_map_stride = iVar33;
  (*ppMVar10)->bsize = bsize;
  if (1 < (int)uVar35) {
    uVar19 = 1;
    do {
      ppMVar10 = (td->dcb).xd.mi;
      ppMVar10[uVar19] = *ppMVar10;
      uVar19 = uVar19 + 1;
    } while (uVar35 != uVar19);
  }
  plane_end = (uint)(uVar3 == '\0') * 2 + 1;
  if (1 < (int)uVar26) {
    iVar16 = uVar26 - 1;
    do {
      ppMVar10 = (td->dcb).xd.mi;
      memcpy(ppMVar10 + iVar33,ppMVar10,(long)(int)uVar35 << 3);
      iVar33 = iVar33 + (pbi->common).mi_params.mi_stride;
      iVar16 = iVar16 + -1;
    } while (iVar16 != 0);
  }
  lVar22 = 0;
  do {
    bVar18 = (byte)((uint)bVar2 * 4 >>
                   (*(byte *)((long)(td->dcb).xd.plane[0].pre + lVar22 + -0x28) & 0x1f));
    bVar25 = (byte)((uint)bVar30 * 4 >>
                   (*(byte *)((long)(td->dcb).xd.plane[0].pre + lVar22 + -0x2c) & 0x1f));
    if (bVar25 < 5) {
      bVar25 = 4;
    }
    *(byte *)((long)((td->dcb).xd.plane[0].seg_iqmatrix + -1) + lVar22 + 0x90) = bVar25;
    if (bVar18 < 5) {
      bVar18 = 4;
    }
    *(byte *)((long)((td->dcb).xd.plane[0].seg_iqmatrix + -1) + lVar22 + 0x91) = bVar18;
    lVar22 = lVar22 + 0xa30;
  } while ((ulong)plane_end * 0xa30 - lVar22 != 0);
  ppMVar10 = (td->dcb).xd.mi;
  ppEVar24 = (td->dcb).xd.above_entropy_context;
  paEVar27 = (td->dcb).xd.left_entropy_context;
  lVar22 = 0;
  uVar34 = mi_row;
  iVar33 = mi_col;
  do {
    BVar4 = (*ppMVar10)->bsize;
    iVar16 = *(int *)((long)(td->dcb).xd.plane[0].pre + lVar22 * 8 + -0x2c);
    uVar28 = mi_row - 1;
    if ((0x20005UL >> (BVar4 & 0x3f) & 1) == 0) {
      uVar28 = uVar34;
    }
    iVar20 = *(int *)((long)(td->dcb).xd.plane[0].pre + lVar22 * 8 + -0x28);
    if (iVar20 == 0) {
      uVar28 = uVar34;
    }
    if ((mi_row & 1U) != 0) {
      uVar34 = uVar28;
    }
    iVar31 = mi_col + -1;
    if ((0x10003UL >> (BVar4 & 0x3f) & 1) == 0) {
      iVar31 = iVar33;
    }
    if (iVar16 == 0) {
      iVar31 = iVar33;
    }
    if ((mi_col & 1U) != 0) {
      iVar33 = iVar31;
    }
    *(ENTROPY_CONTEXT **)((td->dcb).xd.plane[0].seg_dequant_QTX + lVar22 * 2 + -4) =
         *ppEVar24 + (iVar33 >> ((byte)iVar16 & 0x1f));
    *(ENTROPY_CONTEXT **)((td->dcb).xd.plane[0].seg_dequant_QTX + lVar22 * 2 + -2) =
         *paEVar27 + ((uVar34 & 0x1f) >> ((byte)iVar20 & 0x1f));
    lVar22 = lVar22 + 0x146;
    paEVar27 = paEVar27 + 1;
    ppEVar24 = ppEVar24 + 1;
  } while ((ulong)plane_end * 0x146 - lVar22 != 0);
  set_mi_row_col((MACROBLOCKD *)td,&(td->dcb).xd.tile,mi_row,(uint)bVar2,mi_col,(uint)bVar30,
                 (pbi->common).mi_params.mi_rows,(pbi->common).mi_params.mi_cols);
  av1_setup_dst_planes
            ((td->dcb).xd.plane,bsize,&((pbi->common).cur_frame)->buf,mi_row,mi_col,0,plane_end);
  (*(td->dcb).xd.mi)->partition = partition;
  av1_read_mode_info(pbi,&td->dcb,r,uVar35,uVar26);
  if ((BLOCK_8X4 < bsize) &&
     ((((long)pSVar9->subsampling_x != 0 || (pSVar9->subsampling_y != 0)) &&
      (av1_ss_size_lookup[uVar21][pSVar9->subsampling_x][pSVar9->subsampling_y] == BLOCK_INVALID))))
  {
    aom_internal_error((td->dcb).xd.error_info,AOM_CODEC_CORRUPT_FRAME,"Invalid block size.");
  }
  av1_visit_palette(pbi,(MACROBLOCKD *)td,r,av1_decode_palette_tokens);
  uVar3 = ((pbi->common).seq_params)->monochrome;
  mbmi_00 = *(td->dcb).xd.mi;
  uVar7 = *(ushort *)&mbmi_00->field_0xa7;
  bVar13 = true;
  if (-1 < (char)uVar7) {
    bVar13 = '\0' < mbmi_00->ref_frame[0];
  }
  bVar13 = (bool)((char)uVar7 < '\0' | bVar13);
  bVar18 = (pbi->common).features.tx_mode;
  if (((bsize == BLOCK_4X4 || (ulong)bVar18 != 2) || (!(bool)(mbmi_00->skip_txfm == '\0' & bVar13)))
     || ((td->dcb).xd.lossless[uVar7 & 7] != 0)) {
    if ((td->dcb).xd.lossless[uVar7 & 7] == 0) {
      uVar21 = (ulong)mbmi_00->bsize;
      if (uVar21 == 0) {
        bVar30 = '\0';
      }
      else if ((bVar18 == 2) && ((bool)(mbmi_00->skip_txfm == '\0' | bVar13 ^ 1U))) {
        uVar19 = (ulong)(byte)bsize_to_tx_size_cat_bsize_to_tx_size_depth_table[uVar21];
        bVar2 = bsize_to_max_depth_bsize_to_max_depth_table[uVar21];
        bVar30 = ""[uVar21];
        _Var5 = (td->dcb).xd.up_available;
        _Var6 = (td->dcb).xd.left_available;
        bVar18 = *(td->dcb).xd.above_txfm_context;
        if ((_Var5 == true) &&
           ((pMVar11 = (td->dcb).xd.above_mbmi, (pMVar11->field_0xa7 & 0x80) != 0 ||
            ('\0' < pMVar11->ref_frame[0])))) {
          bVar18 = block_size_wide[pMVar11->bsize];
        }
        bVar25 = *(td->dcb).xd.left_txfm_context;
        if ((_Var6 != false) &&
           ((pMVar11 = (td->dcb).xd.left_mbmi, (pMVar11->field_0xa7 & 0x80) != 0 ||
            ('\0' < pMVar11->ref_frame[0])))) {
          bVar25 = block_size_high[pMVar11->bsize];
        }
        pFVar12 = (td->dcb).xd.tile_ctx;
        uVar35 = (uint)(byte)(_Var6 & *(int *)((long)tx_size_high + (ulong)((uint)bVar30 * 4)) <=
                                      (int)(uint)bVar25) +
                 (uint)(byte)(_Var5 & *(int *)((long)tx_size_wide + (ulong)((uint)bVar30 * 4)) <=
                                      (int)(uint)bVar18);
        icdf = pFVar12->tx_size_cdf[uVar19 - 1] + uVar35;
        iVar33 = od_ec_decode_cdf_q15(&r->ec,*icdf,bVar2 + 1);
        if (r->allow_update_cdf != '\0') {
          uVar7 = pFVar12->tx_size_cdf[uVar19 - 1][uVar35][(ulong)bVar2 + 1];
          bVar18 = (char)(uVar7 >> 4) + 4;
          uVar21 = 1;
          if (1 < bVar2) {
            uVar21 = (ulong)(uint)bVar2;
          }
          uVar23 = 0;
          do {
            uVar8 = (*icdf)[uVar23];
            if ((long)uVar23 < (long)(char)iVar33) {
              sVar14 = (short)((int)(0x8000 - (uint)uVar8) >> (bVar18 & 0x1f));
            }
            else {
              sVar14 = -(uVar8 >> (bVar18 & 0x1f));
            }
            (*icdf)[uVar23] = sVar14 + uVar8;
            uVar23 = uVar23 + 1;
          } while (uVar21 != uVar23);
          paVar1 = pFVar12->tx_size_cdf[uVar19 - 1][uVar35] + (ulong)bVar2 + 1;
          *paVar1 = *paVar1 + (ushort)(uVar7 < 0x20);
        }
        if (0 < iVar33) {
          do {
            bVar30 = ""[bVar30];
            iVar33 = iVar33 + -1;
          } while (iVar33 != 0);
        }
      }
      else {
        bVar30 = ""[uVar21];
        if (""[bVar18] < ""[""[uVar21]]) {
          bVar30 = ""[bVar18];
        }
      }
    }
    else {
      bVar30 = 0;
    }
    mbmi_00->tx_size = bVar30;
    if (bVar13) {
      auVar37 = pshuflw(ZEXT216(CONCAT11(bVar30,bVar30)),ZEXT216(CONCAT11(bVar30,bVar30)),0);
      uVar36 = auVar37._0_4_;
      *(undefined4 *)mbmi_00->inter_tx_size = uVar36;
      *(undefined4 *)(mbmi_00->inter_tx_size + 4) = uVar36;
      *(undefined4 *)(mbmi_00->inter_tx_size + 8) = uVar36;
      *(undefined4 *)(mbmi_00->inter_tx_size + 0xc) = uVar36;
    }
    bVar30 = (td->dcb).xd.width;
    bVar2 = (td->dcb).xd.height;
    if (mbmi_00->skip_txfm == '\0') {
      bVar13 = true;
    }
    else if ((mbmi_00->field_0xa7 & 0x80) == 0) {
      bVar13 = mbmi_00->ref_frame[0] < '\x01';
    }
    else {
      bVar13 = false;
    }
    if (bVar13) {
      uVar35 = tx_size_high[mbmi_00->tx_size];
    }
    else {
      uVar35 = (uint)bVar2 * 4 & 0xff;
    }
    if ((ulong)bVar30 != 0) {
      if (bVar13) {
        uVar26 = tx_size_wide[mbmi_00->tx_size];
      }
      else {
        uVar26 = (uint)bVar30 * 4 & 0xff;
      }
      memset((td->dcb).xd.above_txfm_context,uVar26,(ulong)bVar30);
    }
    if ((ulong)bVar2 != 0) {
      memset((td->dcb).xd.left_txfm_context,uVar35 & 0xff,(ulong)bVar2);
    }
  }
  else {
    bVar18 = ""[uVar21];
    iVar33 = tx_size_high_unit[bVar18];
    iVar16 = tx_size_wide_unit[bVar18];
    iVar20 = 0;
    do {
      iVar31 = 0;
      do {
        read_tx_size_vartx((MACROBLOCKD *)td,mbmi_00,bVar18,0,iVar20,iVar31,r);
        iVar31 = iVar31 + iVar16;
      } while (iVar31 < (int)(uint)bVar30);
      iVar20 = iVar20 + iVar33;
      local_80 = (uint)bVar2;
    } while (iVar20 < (int)local_80);
  }
  uVar35 = (uint)(uVar3 == '\0') * 2 + 1;
  if ((pbi->common).delta_q_info.delta_q_present_flag != 0) {
    piVar32 = (td->dcb).xd.plane[0].seg_dequant_QTX[0] + 1;
    lVar22 = 0;
    do {
      iVar33 = av1_get_qindex(&(pbi->common).seg,(int)lVar22,(td->dcb).xd.current_base_qindex);
      lVar29 = 0;
      do {
        lVar17 = (ulong)(lVar29 != 0xa30) * 4 + 0x3dd4;
        if (lVar29 == 0) {
          lVar17 = 0x3dd0;
        }
        if (lVar29 == 0) {
          iVar16 = 0;
        }
        else if (lVar29 == 0xa30) {
          iVar16 = (pbi->common).quant_params.u_ac_delta_q;
        }
        else {
          iVar16 = (pbi->common).quant_params.v_ac_delta_q;
        }
        iVar15 = av1_dc_quant_QTX(iVar33,*(int *)((long)((pbi->dcb).xd.plane[0].pre + -2) + lVar17),
                                  ((pbi->common).seq_params)->bit_depth);
        *(int16_t *)((long)piVar32 + lVar29 + -2) = iVar15;
        iVar15 = av1_ac_quant_QTX(iVar33,iVar16,((pbi->common).seq_params)->bit_depth);
        *(int16_t *)((long)piVar32 + lVar29) = iVar15;
        lVar29 = lVar29 + 0xa30;
      } while ((ulong)uVar35 * 0xa30 - lVar29 != 0);
      lVar22 = lVar22 + 1;
      piVar32 = piVar32 + 2;
    } while (lVar22 != 8);
  }
  if (mbmi_00->skip_txfm != '\0') {
    av1_reset_entropy_context((MACROBLOCKD *)td,bsize,uVar35);
  }
  decode_token_recon_block(pbi,td,r,bsize);
  return;
}

Assistant:

static inline void parse_decode_block(AV1Decoder *const pbi,
                                      ThreadData *const td, int mi_row,
                                      int mi_col, aom_reader *r,
                                      PARTITION_TYPE partition,
                                      BLOCK_SIZE bsize) {
  DecoderCodingBlock *const dcb = &td->dcb;
  MACROBLOCKD *const xd = &dcb->xd;
  decode_mbmi_block(pbi, dcb, mi_row, mi_col, r, partition, bsize);

  av1_visit_palette(pbi, xd, r, av1_decode_palette_tokens);

  AV1_COMMON *cm = &pbi->common;
  const int num_planes = av1_num_planes(cm);
  MB_MODE_INFO *mbmi = xd->mi[0];
  int inter_block_tx = is_inter_block(mbmi) || is_intrabc_block(mbmi);
  if (cm->features.tx_mode == TX_MODE_SELECT && block_signals_txsize(bsize) &&
      !mbmi->skip_txfm && inter_block_tx && !xd->lossless[mbmi->segment_id]) {
    const TX_SIZE max_tx_size = max_txsize_rect_lookup[bsize];
    const int bh = tx_size_high_unit[max_tx_size];
    const int bw = tx_size_wide_unit[max_tx_size];
    const int width = mi_size_wide[bsize];
    const int height = mi_size_high[bsize];

    for (int idy = 0; idy < height; idy += bh)
      for (int idx = 0; idx < width; idx += bw)
        read_tx_size_vartx(xd, mbmi, max_tx_size, 0, idy, idx, r);
  } else {
    mbmi->tx_size = read_tx_size(xd, cm->features.tx_mode, inter_block_tx,
                                 !mbmi->skip_txfm, r);
    if (inter_block_tx)
      memset(mbmi->inter_tx_size, mbmi->tx_size, sizeof(mbmi->inter_tx_size));
    set_txfm_ctxs(mbmi->tx_size, xd->width, xd->height,
                  mbmi->skip_txfm && is_inter_block(mbmi), xd);
  }

  if (cm->delta_q_info.delta_q_present_flag) {
    for (int i = 0; i < MAX_SEGMENTS; i++) {
      const int current_qindex =
          av1_get_qindex(&cm->seg, i, xd->current_base_qindex);
      const CommonQuantParams *const quant_params = &cm->quant_params;
      for (int j = 0; j < num_planes; ++j) {
        const int dc_delta_q = j == 0 ? quant_params->y_dc_delta_q
                                      : (j == 1 ? quant_params->u_dc_delta_q
                                                : quant_params->v_dc_delta_q);
        const int ac_delta_q = j == 0 ? 0
                                      : (j == 1 ? quant_params->u_ac_delta_q
                                                : quant_params->v_ac_delta_q);
        xd->plane[j].seg_dequant_QTX[i][0] = av1_dc_quant_QTX(
            current_qindex, dc_delta_q, cm->seq_params->bit_depth);
        xd->plane[j].seg_dequant_QTX[i][1] = av1_ac_quant_QTX(
            current_qindex, ac_delta_q, cm->seq_params->bit_depth);
      }
    }
  }
  if (mbmi->skip_txfm) av1_reset_entropy_context(xd, bsize, num_planes);

  decode_token_recon_block(pbi, td, r, bsize);
}